

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

int AF_APlayerPawn_GetMaxHealth
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  int iVar3;
  PClass *pPVar4;
  char *__assertion;
  bool bVar5;
  
  pPVar2 = APlayerPawn::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else if (((param->field_0).field_3.Type == '\x03') && ((param->field_0).field_1.atag == 1)) {
    puVar1 = (undefined8 *)(param->field_0).field_1.a;
    pPVar4 = (PClass *)puVar1[1];
    if (pPVar4 == (PClass *)0x0) {
      pPVar4 = (PClass *)(**(code **)*puVar1)(puVar1);
      puVar1[1] = pPVar4;
    }
    bVar5 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar5) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar5 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (bVar5) {
      iVar3 = *(int *)(puVar1 + 0x98);
      if ((*(int *)(puVar1 + 0x98) < 1) && (iVar3 = 100, (i_compatflags._1_1_ & 0x10) == 0)) {
        iVar3 = deh.MaxHealth;
      }
      if (numret < 1) {
        iVar3 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                        ,0x4c9,
                        "int AF_APlayerPawn_GetMaxHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (ret->RegType != '\0') {
          __assert_fail("RegType == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                        ,0x13f,"void VMReturn::SetInt(int)");
        }
        *(int *)ret->Location = iVar3;
        iVar3 = 1;
      }
      return iVar3;
    }
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(APlayerPawn))";
  }
  else {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x4c8,
                "int AF_APlayerPawn_GetMaxHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(APlayerPawn, GetMaxHealth)
{
	PARAM_SELF_PROLOGUE(APlayerPawn);
	ACTION_RETURN_INT(self->GetMaxHealth());
}